

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode ossl_connect_step3(Curl_cfilter *cf,Curl_easy *data)

{
  void *pvVar1;
  CURLcode CVar2;
  ossl_ctx *octx;
  ssl_connect_data *connssl;
  CURLcode result;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  CVar2 = Curl_oss_check_peer_cert
                    (cf,data,*(ossl_ctx **)((long)pvVar1 + 0x40),(ssl_peer *)((long)pvVar1 + 8));
  if (CVar2 != CURLE_OK) {
    Curl_ssl_scache_remove_all(cf,data,*(char **)((long)pvVar1 + 0x20));
  }
  return CVar2;
}

Assistant:

static CURLcode ossl_connect_step3(struct Curl_cfilter *cf,
                                   struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct ssl_connect_data *connssl = cf->ctx;
  struct ossl_ctx *octx = (struct ossl_ctx *)connssl->backend;

  DEBUGASSERT(ssl_connect_3 == connssl->connecting_state);

  /*
   * We check certificates to authenticate the server; otherwise we risk
   * man-in-the-middle attack; NEVERTHELESS, if we are told explicitly not to
   * verify the peer, ignore faults and failures from the server cert
   * operations.
   */

  result = Curl_oss_check_peer_cert(cf, data, octx, &connssl->peer);
  if(result)
    /* on error, remove sessions we might have in the pool */
    Curl_ssl_scache_remove_all(cf, data, connssl->peer.scache_key);

  return result;
}